

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# histo.c
# Opt level: O2

int ffhist(fitsfile **fptr,char *outfile,int imagetype,int naxis,char (*colname) [71],double *minin,
          double *maxin,double *binsizein,char (*minname) [71],char (*maxname) [71],
          char (*binname) [71],double weightin,char *wtcol,int recip,char *selectrow,int *status)

{
  double dVar1;
  double dVar2;
  byte bVar3;
  fitsfile **ppfVar4;
  int iVar5;
  int iVar6;
  ulong uVar7;
  long lVar8;
  size_t sVar9;
  undefined4 in_register_0000000c;
  long lVar10;
  char *pcVar11;
  long lVar12;
  char *pcVar13;
  undefined4 uVar17;
  double *pdVar14;
  long lVar15;
  bool bVar16;
  undefined4 uVar18;
  double dVar19;
  double dVar20;
  int iStackY_5e0;
  int tstatus;
  double local_5c8;
  fitsfile **local_5c0;
  fitsfile *histptr;
  double local_5b0;
  int local_5a8;
  int local_5a4;
  double *local_5a0;
  double local_598;
  int datatype;
  undefined8 local_588;
  ulong local_580;
  long local_578;
  int nkeys;
  double amin [4];
  double datamax;
  double binsize [4];
  long haxes [4];
  char card [81];
  double datamin;
  double maxbin [4];
  double amax [4];
  histType histData;
  char keyname [75];
  char svalue [71];
  char errmsg [81];
  char cpref [4] [71];
  
  local_580 = CONCAT44(in_register_0000000c,naxis);
  datamin = -9.1191291391491e-36;
  datamax = -9.1191291391491e-36;
  if (0 < *status) {
    return *status;
  }
  local_5c0 = fptr;
  if (4 < naxis) {
    ffpmsg("histogram has more than 4 dimensions");
    *status = 0x140;
    return 0x140;
  }
  histData.tblptr = *fptr;
  local_598 = weightin;
  if ((histData.tblptr)->HDUposition != (histData.tblptr)->Fptr->curhdu) {
    ffmahd(histData.tblptr,(histData.tblptr)->HDUposition + 1,(int *)0x0,status);
    histData.tblptr = *local_5c0;
  }
  histData.haxis = (int)local_580;
  histData.rowselector = selectrow;
  if (imagetype == 0xb) {
    iStackY_5e0 = 8;
  }
  else if (imagetype == 0x52) {
    iStackY_5e0 = -0x40;
  }
  else if (imagetype == 0x1f) {
    iStackY_5e0 = 0x20;
  }
  else if (imagetype == 0x2a) {
    iStackY_5e0 = -0x20;
  }
  else {
    if (imagetype != 0x15) {
      *status = 0x19a;
      return 0x19a;
    }
    iStackY_5e0 = 0x10;
  }
  local_5a4 = iStackY_5e0;
  tstatus = 0;
  local_588 = 0;
  pcVar13 = cpref[0];
  local_5a8 = imagetype;
  local_5a0 = minin;
  histData.himagetype = imagetype;
  ffgky(histData.tblptr,0x10,"CPREF",pcVar13,(char *)0x0,&tstatus);
  uVar17 = SUB84(local_598,0);
  uVar18 = (undefined4)((ulong)local_598 >> 0x20);
  if (tstatus == 0) {
LAB_001787c2:
    if (*pcVar13 == '\0') goto LAB_0017818d;
    if (*pcVar13 != ',') goto LAB_001787bf;
    *pcVar13 = '\0';
    do {
      pcVar11 = pcVar13 + 1;
      pcVar13 = pcVar13 + 1;
    } while (*pcVar11 == ' ');
    pcVar11 = cpref[1];
    strcpy(pcVar11,pcVar13);
    uVar17 = SUB84(local_598,0);
    uVar18 = (undefined4)((ulong)local_598 >> 0x20);
    while( true ) {
      if (*pcVar11 == '\0') goto LAB_0017818d;
      if (*pcVar11 == ',') break;
      pcVar11 = pcVar11 + 1;
    }
    *pcVar11 = '\0';
    do {
      pcVar13 = pcVar11 + 1;
      pcVar11 = pcVar11 + 1;
    } while (*pcVar13 == ' ');
    pcVar13 = cpref[2];
    strcpy(pcVar13,pcVar11);
    uVar17 = SUB84(local_598,0);
    uVar18 = (undefined4)((ulong)local_598 >> 0x20);
LAB_0017898c:
    if (*pcVar13 != '\0') {
      if (*pcVar13 != ',') goto code_r0x001789a0;
      *pcVar13 = '\0';
      do {
        pcVar11 = pcVar13 + 1;
        pcVar13 = pcVar13 + 1;
      } while (*pcVar11 == ' ');
      strcpy(cpref[3],pcVar13);
      uVar17 = SUB84(local_598,0);
      uVar18 = (undefined4)((ulong)local_598 >> 0x20);
    }
  }
LAB_0017818d:
  uVar7 = local_580 & 0xffffffff;
  if ((int)local_580 < 1) {
    uVar7 = 0;
  }
  local_580 = uVar7 << 3;
  local_5b0 = 2.47032822920623e-323;
  lVar12 = 0x14;
  lVar10 = 0;
  bVar3 = 0;
  for (lVar15 = 0; local_580 != lVar15; lVar15 = lVar15 + 8) {
    if ((*minname)[lVar10] != '\0') {
      iVar5 = ffgky(*local_5c0,0x52,*minname + lVar10,(void *)((long)local_5a0 + lVar15),(char *)0x0
                    ,status);
      if (iVar5 == 0) goto LAB_0017821c;
      pcVar13 = "error reading histogramming minimum keyword";
      wtcol = *minname + lVar10;
LAB_001789b5:
      ffpmsg(pcVar13);
      goto LAB_001789bd;
    }
LAB_0017821c:
    if ((*maxname)[lVar10] != '\0') {
      iVar5 = ffgky(*local_5c0,0x52,*maxname + lVar10,(void *)((long)maxin + lVar15),(char *)0x0,
                    status);
      if (iVar5 != 0) {
        pcVar13 = "error reading histogramming maximum keyword";
        wtcol = *maxname + lVar10;
        goto LAB_001789b5;
      }
    }
    ppfVar4 = local_5c0;
    if ((*binname)[lVar10] != '\0') {
      pcVar13 = *binname + lVar10;
      iVar5 = ffgky(*local_5c0,0x52,pcVar13,(void *)(lVar15 + (long)binsizein),(char *)0x0,status);
      if (iVar5 != 0) {
        ffpmsg("error reading histogramming binsize keyword");
        goto LAB_00178a42;
      }
    }
    local_578 = lVar10;
    if ((*(double *)((long)binsizein + lVar15) == 0.0) &&
       (!NAN(*(double *)((long)binsizein + lVar15)))) {
      ffpmsg("error: histogram binsize = 0");
      *status = 0x142;
      return 0x142;
    }
    pcVar11 = *colname + lVar10;
    if (((*colname)[lVar10] == '\0') &&
       (uVar7 = (long)local_5b0 - 5, strcpy(pcVar11,cpref[0] + lVar10),
       uVar7 < 4 && *pcVar11 == '\0')) {
      *(short *)pcVar11 = (short)(0x54005a00590058 >> (bVar3 & 0x3f));
    }
    iVar5 = ffgcno(*ppfVar4,0,pcVar11,(int *)((long)histData.hcolnum + lVar12 + -0x14),status);
    if (0 < iVar5) {
      builtin_strncpy(errmsg + 0x20,"t exist: ",10);
      builtin_strncpy(errmsg + 0x10,"gram axis doesn\'",0x10);
      builtin_strncpy(errmsg,"column for histo",0x10);
LAB_00178a26:
      sVar9 = strlen(errmsg);
LAB_00178a3a:
      pcVar13 = errmsg;
      strncat(pcVar13,pcVar11,0x50 - sVar9);
LAB_00178a42:
      ffpmsg(pcVar13);
      return *status;
    }
    if (1 < (int)(*local_5c0)->Fptr->tableptr[(long)histData.hcolnum[(long)local_5b0 + -5] + -1].
                 trepeat) {
      builtin_strncpy(errmsg + 0x10,"or column: ",0xc);
      uVar17._0_1_ = 'C';
      uVar17._1_1_ = 'a';
      uVar17._2_1_ = 'n';
      uVar17._3_1_ = '\'';
      uVar18._0_1_ = 't';
      uVar18._1_1_ = ' ';
      uVar18._2_1_ = 'b';
      uVar18._3_1_ = 'i';
      errmsg[8] = 'n';
      errmsg[9] = ' ';
      errmsg[10] = 'a';
      errmsg[0xb] = ' ';
      errmsg[0xc] = 'v';
      errmsg[0xd] = 'e';
      errmsg[0xe] = 'c';
      errmsg[0xf] = 't';
LAB_00178928:
      errmsg[4] = (char)uVar18;
      errmsg[5] = SUB41(uVar18,1);
      errmsg[6] = SUB41(uVar18,2);
      errmsg[7] = SUB41(uVar18,3);
      errmsg[0] = (char)uVar17;
      errmsg[1] = SUB41(uVar17,1);
      errmsg[2] = SUB41(uVar17,2);
      errmsg[3] = SUB41(uVar17,3);
      sVar9 = strlen(errmsg);
      strncat(errmsg,pcVar11,0x50 - sVar9);
      ffpmsg(errmsg);
      *status = 0x19a;
      return 0x19a;
    }
    ffeqty(*local_5c0,histData.hcolnum[(long)local_5b0 + -5],&datatype,(long *)0x0,(long *)0x0,
           status);
    if ((datatype < 0) || (datatype == 0x10)) {
      builtin_strncpy(errmsg + 0x20,"n this column: ",0xf);
      errmsg._47_4_ = errmsg._47_4_ & 0xffffff00;
      builtin_strncpy(errmsg + 0x10,"tatype; can\'t bi",0x10);
      uVar17._0_1_ = 'I';
      uVar17._1_1_ = 'n';
      uVar17._2_1_ = 'a';
      uVar17._3_1_ = 'p';
      uVar18._0_1_ = 'p';
      uVar18._1_1_ = 'r';
      uVar18._2_1_ = 'o';
      uVar18._3_1_ = 'p';
      errmsg[8] = 'r';
      errmsg[9] = 'i';
      errmsg[10] = 'a';
      errmsg[0xb] = 't';
      errmsg[0xc] = 'e';
      errmsg[0xd] = ' ';
      errmsg[0xe] = 'd';
      errmsg[0xf] = 'a';
      goto LAB_00178928;
    }
    dVar19 = *(double *)((long)local_5a0 + lVar15);
    if ((dVar19 != -9.1191291391491e-36) || (NAN(dVar19))) {
      *(double *)((long)amin + lVar15) = dVar19;
    }
    else {
      ffkeyn("TLMIN",histData.hcolnum[(long)local_5b0 + -5],keyname,status);
      iVar5 = ffgky(*local_5c0,0x52,keyname,(double *)((long)amin + lVar15),(char *)0x0,status);
      if (0 < iVar5) {
        *status = 0;
        iVar5 = fits_get_col_minmax(*local_5c0,histData.hcolnum[(long)local_5b0 + -5],
                                    (double *)((long)amin + lVar15),&datamax,status);
        if (0 < iVar5) {
          builtin_strncpy(errmsg,"Error calculating datamin and datamax for column: ",0x33);
          goto LAB_00178a26;
        }
      }
    }
    dVar19 = *(double *)((long)maxin + lVar15);
    if ((dVar19 != -9.1191291391491e-36) || (NAN(dVar19))) {
      *(double *)((long)amax + lVar15) = dVar19;
    }
    else {
      ffkeyn("TLMAX",histData.hcolnum[(long)local_5b0 + -5],keyname,status);
      pdVar14 = (double *)((long)amax + lVar15);
      iVar5 = ffgky(*local_5c0,0x52,keyname,pdVar14,(char *)0x0,status);
      local_588 = 1;
      if (0 < iVar5) {
        *status = 0;
        if ((datamax != -9.1191291391491e-36) || (NAN(datamax))) {
          *pdVar14 = datamax;
          local_588 = 1;
        }
        else {
          iVar5 = fits_get_col_minmax(*local_5c0,histData.hcolnum[(long)local_5b0 + -5],&datamin,
                                      pdVar14,status);
          local_588 = 1;
          if (0 < iVar5) {
            builtin_strncpy(errmsg,"Error calculating datamin and datamax for column: ",0x33);
            sVar9 = strlen(errmsg);
            goto LAB_00178a3a;
          }
        }
      }
    }
    ppfVar4 = local_5c0;
    pdVar14 = (double *)((long)binsizein + lVar15);
    dVar19 = *pdVar14;
    if ((dVar19 == -9.1191291391491e-36) && (!NAN(dVar19))) {
      tstatus = 0;
      ffkeyn("TDBIN",histData.hcolnum[(long)local_5b0 + -5],keyname,&tstatus);
      iVar5 = ffgky(*ppfVar4,0x52,keyname,pdVar14,(char *)0x0,&tstatus);
      lVar10 = local_578;
      if (iVar5 < 1) {
        dVar19 = *pdVar14;
      }
      else {
        dVar19 = (*(double *)((long)amax + lVar15) - *(double *)((long)amin + lVar15)) / 10.0;
        *pdVar14 = dVar19;
        if (1.0 < dVar19) {
          *pdVar14 = 1.0;
          dVar19 = 1.0;
        }
      }
    }
    dVar1 = *(double *)((long)amin + lVar15);
    dVar2 = *(double *)((long)amax + lVar15);
    if (((dVar2 < dVar1) && (0.0 < dVar19)) || ((dVar1 < dVar2 && (dVar19 < 0.0)))) {
      dVar19 = -dVar19;
    }
    *(double *)((long)binsize + lVar15) = dVar19;
    if (datatype < 0x2a) {
      if ((dVar1 != (double)(int)dVar1) || (NAN(dVar1) || NAN((double)(int)dVar1)))
      goto LAB_00178712;
      if ((dVar2 != (double)(int)dVar2) || (NAN(dVar2) || NAN((double)(int)dVar2)))
      goto LAB_00178712;
      if ((dVar19 != (double)(int)dVar19) || (NAN(dVar19) || NAN((double)(int)dVar19)))
      goto LAB_00178712;
      iVar5 = ((int)dVar2 - (int)dVar1) / (int)dVar19 + 1;
      *(long *)((long)haxes + lVar15) = (long)iVar5;
      *(double *)((long)maxbin + lVar15) = (double)iVar5 + 1.0;
      if (dVar2 <= dVar1) {
        *(double *)((long)amin + lVar15) = dVar1 + 0.5;
        dVar2 = dVar2 + -0.5;
      }
      else {
        *(double *)((long)amin + lVar15) = dVar1 + -0.5;
        dVar2 = dVar2 + 0.5;
      }
      *(double *)((long)amax + lVar15) = dVar2;
      goto LAB_0017879a;
    }
LAB_00178712:
    dVar20 = (dVar2 - dVar1) / dVar19;
    *(double *)((long)maxbin + lVar15) = dVar20;
    if ((int)local_588 == 0) {
      lVar8 = (long)dVar20;
      *(long *)((long)haxes + lVar15) = lVar8;
      dVar19 = (double)lVar8 * dVar19 + dVar1;
      if (dVar2 <= dVar1) {
        if (dVar2 < dVar19) goto LAB_0017878f;
      }
      else if (dVar19 < dVar2) {
LAB_0017878f:
        lVar8 = lVar8 + 1;
        goto LAB_00178792;
      }
    }
    else {
      lVar8 = (long)(dVar20 + 1.0);
LAB_00178792:
      *(long *)((long)haxes + lVar15) = lVar8;
    }
LAB_0017879a:
    local_5b0 = (double)((long)local_5b0 + 1);
    bVar3 = bVar3 + 0x10;
    lVar12 = lVar12 + 4;
    lVar10 = lVar10 + 0x47;
    uVar17 = SUB84(local_598,0);
    uVar18 = (undefined4)((ulong)local_598 >> 0x20);
  }
  if (*wtcol == '\0') {
    histData.weight = (double)CONCAT44(uVar18,uVar17);
LAB_00178a94:
    if ((histData.weight <= 0.0) &&
       ((histData.weight != -9.1191291391491e-36 || (NAN(histData.weight))))) {
      ffpmsg("Illegal histogramming weighting factor <= 0.");
      *status = 0x7d;
      return 0x7d;
    }
    if ((recip != 0) && ((histData.weight != -9.1191291391491e-36 || (NAN(histData.weight))))) {
      histData.weight = 1.0 / histData.weight;
    }
LAB_00178b11:
    histData.wtrecip = recip;
    iVar5 = ffinit(&histptr,outfile,status);
    if (iVar5 < 1) {
      iVar5 = ffcrim(histptr,local_5a4,histData.haxis,haxes,status);
      if (iVar5 < 1) {
        ffghsp(*local_5c0,&nkeys,(int *)0x0,status);
        for (iVar5 = 1; iVar5 <= nkeys; iVar5 = iVar5 + 1) {
          ffgrec(*local_5c0,iVar5,card,status);
          iVar6 = ffgkcl(card);
          if (0x77 < iVar6) {
            ffprec(histptr,card,status);
          }
        }
        histData.amin1 = amin[0];
        histData.maxbin1 = maxbin[0];
        local_5b0 = binsize[0];
        histData.binsize1 = binsize[0];
        histData.haxis1 = haxes[0];
        if (1 < histData.haxis) {
          histData.amin2 = amin[1];
          histData.maxbin2 = maxbin[1];
          histData.binsize2 = binsize[1];
          histData.haxis2 = haxes[1];
          if (histData.haxis != 2) {
            histData.amin3 = amin[2];
            histData.maxbin3 = maxbin[2];
            histData.binsize3 = binsize[2];
            histData.haxis3 = haxes[2];
            if (3 < (uint)histData.haxis) {
              histData.amin4 = amin[3];
              histData.maxbin4 = maxbin[3];
              histData.binsize4 = binsize[3];
              histData.haxis4 = haxes[3];
            }
          }
        }
        fits_iter_set_file((iteratorCol *)errmsg,histptr);
        fits_iter_set_datatype((iteratorCol *)errmsg,local_5a8);
        fits_iter_set_iotype((iteratorCol *)errmsg,2);
        iVar5 = ffiter(1,(iteratorCol *)errmsg,0,-1,ffwritehisto,&histData,status);
        if (iVar5 == 0) {
          lVar12 = 0;
LAB_00178dc2:
          if (lVar12 < histData.haxis) {
            tstatus = 0;
            ffkeyn("TCTYP",histData.hcolnum[lVar12],keyname,&tstatus);
            ppfVar4 = local_5c0;
            ffgky(*local_5c0,0x10,keyname,svalue,(char *)0x0,&tstatus);
            if (tstatus == 0) {
LAB_00178e67:
              ffkeyn("CTYPE",(int)lVar12 + 1,keyname,&tstatus);
              ffpky(histptr,0x10,keyname,svalue,"Coordinate Type",&tstatus);
            }
            else {
              tstatus = 0;
              ffkeyn("TTYPE",histData.hcolnum[lVar12],keyname,&tstatus);
              ffgky(*ppfVar4,0x10,keyname,svalue,(char *)0x0,&tstatus);
              if (tstatus == 0) goto LAB_00178e67;
              tstatus = 0;
            }
            ffkeyn("TCUNI",histData.hcolnum[lVar12],keyname,&tstatus);
            ppfVar4 = local_5c0;
            ffgky(*local_5c0,0x10,keyname,svalue,(char *)0x0,&tstatus);
            if (tstatus == 0) {
LAB_00178f1a:
              ffkeyn("CUNIT",(int)lVar12 + 1,keyname,&tstatus);
              ffpky(histptr,0x10,keyname,svalue,"Coordinate Units",&tstatus);
            }
            else {
              tstatus = 0;
              ffkeyn("TUNIT",histData.hcolnum[lVar12],keyname,&tstatus);
              ffgky(*ppfVar4,0x10,keyname,svalue,(char *)0x0,&tstatus);
              if (tstatus == 0) goto LAB_00178f1a;
              tstatus = 0;
            }
            ffkeyn("TCRPX",histData.hcolnum[lVar12],keyname,&tstatus);
            ffgky(*local_5c0,0x52,keyname,&local_5c8,(char *)0x0,&tstatus);
            if (tstatus == 0) {
              local_5c8 = (local_5c8 - amin[lVar12]) / binsize[lVar12] + 0.5;
            }
            else {
              tstatus = 0;
              local_5c8 = 1.0;
            }
            lVar10 = lVar12 + 1;
            iVar5 = (int)lVar10;
            ffkeyn("CRPIX",iVar5,keyname,&tstatus);
            ffpky(histptr,0x52,keyname,&local_5c8,"Reference Pixel",&tstatus);
            ffkeyn("TCRVL",histData.hcolnum[lVar12],keyname,&tstatus);
            ffgky(*local_5c0,0x52,keyname,&local_5c8,(char *)0x0,&tstatus);
            if (tstatus != 0) {
              local_5c8 = binsize[lVar12] * 0.5 + amin[lVar12];
              tstatus = 0;
            }
            ffkeyn("CRVAL",iVar5,keyname,&tstatus);
            ffpky(histptr,0x52,keyname,&local_5c8,"Reference Value",&tstatus);
            ffkeyn("TCDLT",histData.hcolnum[lVar12],keyname,&tstatus);
            ffgky(*local_5c0,0x52,keyname,&local_5c8,(char *)0x0,&tstatus);
            if (tstatus == 0) {
              uVar17 = SUB84(local_5c8,0);
              uVar18 = (undefined4)((ulong)local_5c8 >> 0x20);
            }
            else {
              tstatus = 0;
              uVar17 = 0;
              uVar18 = 0x3ff00000;
            }
            local_5c8 = (double)CONCAT44(uVar18,uVar17) * binsize[lVar12];
            ffkeyn("CDELT",iVar5,keyname,&tstatus);
            ffpky(histptr,0x52,keyname,&local_5c8,"Pixel size",&tstatus);
            bVar16 = lVar12 == 1;
            lVar12 = lVar10;
            if (bVar16) {
              ffkeyn("TCROT",histData.hcolnum[1],keyname,&tstatus);
              ffgky(*local_5c0,0x52,keyname,&local_5c8,(char *)0x0,&tstatus);
              if ((tstatus != 0) || ((local_5c8 == 0.0 && (!NAN(local_5c8))))) {
                tstatus = 0;
                ffkeyn("TCROT",histData.hcolnum[0],keyname,&tstatus);
                ffgky(*local_5c0,0x52,keyname,&local_5c8,(char *)0x0,&tstatus);
                if ((tstatus != 0) || ((local_5c8 == 0.0 && (!NAN(local_5c8))))) goto LAB_00178dc2;
                local_5c8 = -local_5c8;
              }
              ffkeyn("CROTA",iVar5,keyname,&tstatus);
              ffpky(histptr,0x52,keyname,&local_5c8,"Rotation angle",&tstatus);
            }
            goto LAB_00178dc2;
          }
          if (histData.haxis == 2) {
            tstatus = 0;
            ffkeyn("TP",histData.hcolnum[0],card,&tstatus);
            sVar9 = strlen(card);
            (card + sVar9)[0] = '_';
            (card + sVar9)[1] = '\0';
            ffkeyn(card,histData.hcolnum[0],keyname,&tstatus);
            ppfVar4 = local_5c0;
            ffgky(*local_5c0,0x52,keyname,&local_5c8,card,&tstatus);
            if (tstatus == 0) {
              ffpky(histptr,0x52,"PC1_1",&local_5c8,card,&tstatus);
            }
            tstatus = 0;
            keyname[1] = 'C';
            ffgky(*ppfVar4,0x52,keyname,&local_5c8,card,&tstatus);
            if (tstatus == 0) {
              local_5c8 = local_5c8 * local_5b0;
              ffpky(histptr,0x52,"CD1_1",&local_5c8,card,&tstatus);
            }
            tstatus = 0;
            ffkeyn("TP",histData.hcolnum[0],card,&tstatus);
            sVar9 = strlen(card);
            (card + sVar9)[0] = '_';
            (card + sVar9)[1] = '\0';
            ffkeyn(card,histData.hcolnum[1],keyname,&tstatus);
            ffgky(*ppfVar4,0x52,keyname,&local_5c8,card,&tstatus);
            if (tstatus == 0) {
              ffpky(histptr,0x52,"PC1_2",&local_5c8,card,&tstatus);
            }
            tstatus = 0;
            keyname[1] = 'C';
            ffgky(*ppfVar4,0x52,keyname,&local_5c8,card,&tstatus);
            if (tstatus == 0) {
              local_5c8 = local_5b0 * local_5c8;
              ffpky(histptr,0x52,"CD1_2",&local_5c8,card,&tstatus);
            }
            tstatus = 0;
            ffkeyn("TP",histData.hcolnum[1],card,&tstatus);
            sVar9 = strlen(card);
            (card + sVar9)[0] = '_';
            (card + sVar9)[1] = '\0';
            ffkeyn(card,histData.hcolnum[0],keyname,&tstatus);
            ffgky(*ppfVar4,0x52,keyname,&local_5c8,card,&tstatus);
            if (tstatus == 0) {
              ffpky(histptr,0x52,"PC2_1",&local_5c8,card,&tstatus);
            }
            tstatus = 0;
            keyname[1] = 'C';
            ffgky(*ppfVar4,0x52,keyname,&local_5c8,card,&tstatus);
            if (tstatus == 0) {
              local_5c8 = binsize[1] * local_5c8;
              ffpky(histptr,0x52,"CD2_1",&local_5c8,card,&tstatus);
            }
            tstatus = 0;
            ffkeyn("TP",histData.hcolnum[1],card,&tstatus);
            sVar9 = strlen(card);
            (card + sVar9)[0] = '_';
            (card + sVar9)[1] = '\0';
            ffkeyn(card,histData.hcolnum[1],keyname,&tstatus);
            ffgky(*ppfVar4,0x52,keyname,&local_5c8,card,&tstatus);
            if (tstatus == 0) {
              ffpky(histptr,0x52,"PC2_2",&local_5c8,card,&tstatus);
            }
            tstatus = 0;
            keyname[1] = 'C';
            ffgky(*ppfVar4,0x52,keyname,&local_5c8,card,&tstatus);
            if (tstatus == 0) {
              local_5c8 = binsize[1] * local_5c8;
              ffpky(histptr,0x52,"CD2_2",&local_5c8,card,&tstatus);
            }
          }
          ppfVar4 = local_5c0;
          ffclos(*local_5c0,status);
          *ppfVar4 = histptr;
        }
        return *status;
      }
      ffpmsg("failed to create primary array histogram in temp file");
      ffclos(histptr,status);
      goto LAB_001789c2;
    }
    wtcol = "failed to create temp output file for histogram";
  }
  else {
    iVar5 = ffgky(*local_5c0,0x52,wtcol,&histData.weight,(char *)0x0,status);
    if (iVar5 == 0) goto LAB_00178a94;
    *status = 0;
    iVar5 = ffgcno(*local_5c0,0,wtcol,&histData.wtcolnum,status);
    if (iVar5 < 1) {
      histData.weight = -9.1191291391491e-36;
      goto LAB_00178b11;
    }
    ffpmsg("keyword or column for histogram weights doesn\'t exist: ");
  }
LAB_001789bd:
  ffpmsg(wtcol);
LAB_001789c2:
  return *status;
LAB_001787bf:
  pcVar13 = pcVar13 + 1;
  goto LAB_001787c2;
code_r0x001789a0:
  pcVar13 = pcVar13 + 1;
  goto LAB_0017898c;
}

Assistant:

int ffhist(fitsfile **fptr,  /* IO - pointer to table with X and Y cols;    */
                             /*     on output, points to histogram image    */
           char *outfile,    /* I - name for the output histogram file      */
           int imagetype,    /* I - datatype for image: TINT, TSHORT, etc   */
           int naxis,        /* I - number of axes in the histogram image   */
           char colname[4][FLEN_VALUE],   /* I - column names               */
           double *minin,     /* I - minimum histogram value, for each axis */
           double *maxin,     /* I - maximum histogram value, for each axis */
           double *binsizein, /* I - bin size along each axis               */
           char minname[4][FLEN_VALUE], /* I - optional keywords for min    */
           char maxname[4][FLEN_VALUE], /* I - optional keywords for max    */
           char binname[4][FLEN_VALUE], /* I - optional keywords for binsize */
           double weightin,        /* I - binning weighting factor          */
           char wtcol[FLEN_VALUE], /* I - optional keyword or col for weight*/
           int recip,              /* I - use reciprocal of the weight?     */
           char *selectrow,        /* I - optional array (length = no. of   */
                             /* rows in the table).  If the element is true */
                             /* then the corresponding row of the table will*/
                             /* be included in the histogram, otherwise the */
                             /* row will be skipped.  Ingnored if *selectrow*/
                             /* is equal to NULL.                           */
           int *status)
{
    int ii, datatype, repeat, imin, imax, ibin, bitpix, tstatus, use_datamax = 0;
    long haxes[4];
    fitsfile *histptr;
    char errmsg[FLEN_ERRMSG], keyname[FLEN_KEYWORD], card[FLEN_CARD];
    tcolumn *colptr;
    iteratorCol imagepars[1];
    int n_cols = 1, nkeys;
    long  offset = 0;
    long n_per_loop = -1;  /* force whole array to be passed at one time */
    histType histData;    /* Structure holding histogram info for iterator */
    
    double amin[4], amax[4], binsize[4], maxbin[4];
    double datamin = DOUBLENULLVALUE, datamax = DOUBLENULLVALUE;
    char svalue[FLEN_VALUE];
    double dvalue;
    char cpref[4][FLEN_VALUE];
    char *cptr;

    if (*status > 0)
        return(*status);

    if (naxis > 4)
    {
        ffpmsg("histogram has more than 4 dimensions");
        return(*status = BAD_DIMEN);
    }

    /* reset position to the correct HDU if necessary */
    if ((*fptr)->HDUposition != ((*fptr)->Fptr)->curhdu)
        ffmahd(*fptr, ((*fptr)->HDUposition) + 1, NULL, status);

    histData.tblptr     = *fptr;
    histData.himagetype = imagetype;
    histData.haxis      = naxis;
    histData.rowselector = selectrow;

    if (imagetype == TBYTE)
        bitpix = BYTE_IMG;
    else if (imagetype == TSHORT)
        bitpix = SHORT_IMG;
    else if (imagetype == TINT)
        bitpix = LONG_IMG;
    else if (imagetype == TFLOAT)
        bitpix = FLOAT_IMG;
    else if (imagetype == TDOUBLE)
        bitpix = DOUBLE_IMG;
    else
        return(*status = BAD_DATATYPE);

    /* The CPREF keyword, if it exists, gives the preferred columns. */
    /* Otherwise, assume "X", "Y", "Z", and "T"  */

    tstatus = 0;
    ffgky(*fptr, TSTRING, "CPREF", cpref[0], NULL, &tstatus);

    if (!tstatus)
    {
        /* Preferred column names are given;  separate them */
        cptr = cpref[0];

        /* the first preferred axis... */
        while (*cptr != ',' && *cptr != '\0')
           cptr++;

        if (*cptr != '\0')
        {
           *cptr = '\0';
           cptr++;
           while (*cptr == ' ')
               cptr++;

           strcpy(cpref[1], cptr);
           cptr = cpref[1];

          /* the second preferred axis... */
          while (*cptr != ',' && *cptr != '\0')
             cptr++;

          if (*cptr != '\0')
          {
             *cptr = '\0';
             cptr++;
             while (*cptr == ' ')
                 cptr++;

             strcpy(cpref[2], cptr);
             cptr = cpref[2];

            /* the third preferred axis... */
            while (*cptr != ',' && *cptr != '\0')
               cptr++;

            if (*cptr != '\0')
            {
               *cptr = '\0';
               cptr++;
               while (*cptr == ' ')
                   cptr++;

               strcpy(cpref[3], cptr);

            }
          }
        }
    }

    for (ii = 0; ii < naxis; ii++)
    {

      /* get the min, max, and binsize values from keywords, if specified */

      if (*minname[ii])
      {
         if (ffgky(*fptr, TDOUBLE, minname[ii], &minin[ii], NULL, status) )
         {
             ffpmsg("error reading histogramming minimum keyword");
             ffpmsg(minname[ii]);
             return(*status);
         }
      }

      if (*maxname[ii])
      {
         if (ffgky(*fptr, TDOUBLE, maxname[ii], &maxin[ii], NULL, status) )
         {
             ffpmsg("error reading histogramming maximum keyword");
             ffpmsg(maxname[ii]);
             return(*status);
         }
      }

      if (*binname[ii])
      {
         if (ffgky(*fptr, TDOUBLE, binname[ii], &binsizein[ii], NULL, status) )
         {
             ffpmsg("error reading histogramming binsize keyword");
             ffpmsg(binname[ii]);
             return(*status);
         }
      }

      if (binsizein[ii] == 0.)
      {
        ffpmsg("error: histogram binsize = 0");
        return(*status = ZERO_SCALE);
      }

      if (*colname[ii] == '\0')
      {
         strcpy(colname[ii], cpref[ii]); /* try using the preferred column */
         if (*colname[ii] == '\0')
         {
           if (ii == 0)
              strcpy(colname[ii], "X");
           else if (ii == 1)
              strcpy(colname[ii], "Y");
           else if (ii == 2)
              strcpy(colname[ii], "Z");
           else if (ii == 3)
              strcpy(colname[ii], "T");
         }
      }

      /* get the column number in the table */
      if (ffgcno(*fptr, CASEINSEN, colname[ii], histData.hcolnum+ii, status)
              > 0)
      {
        strcpy(errmsg, "column for histogram axis doesn't exist: ");
        strncat(errmsg, colname[ii], FLEN_ERRMSG-strlen(errmsg)-1);
        ffpmsg(errmsg);
        return(*status);
      }

      colptr = ((*fptr)->Fptr)->tableptr;
      colptr += (histData.hcolnum[ii] - 1);

      repeat = (int) colptr->trepeat;  /* vector repeat factor of the column */
      if (repeat > 1)
      {
        strcpy(errmsg, "Can't bin a vector column: ");
        strncat(errmsg, colname[ii],FLEN_ERRMSG-strlen(errmsg)-1);
        ffpmsg(errmsg);
        return(*status = BAD_DATATYPE);
      }

      /* get the datatype of the column */
      fits_get_eqcoltype(*fptr, histData.hcolnum[ii], &datatype,
         NULL, NULL, status);

      if (datatype < 0 || datatype == TSTRING)
      {
        strcpy(errmsg, "Inappropriate datatype; can't bin this column: ");
        strncat(errmsg, colname[ii],FLEN_ERRMSG-strlen(errmsg)-1);
        ffpmsg(errmsg);
        return(*status = BAD_DATATYPE);
      }

      /* use TLMINn and TLMAXn keyword values if min and max were not given */
      /* else use actual data min and max if TLMINn and TLMAXn don't exist */
 
      if (minin[ii] == DOUBLENULLVALUE)
      {
        ffkeyn("TLMIN", histData.hcolnum[ii], keyname, status);
        if (ffgky(*fptr, TDOUBLE, keyname, amin+ii, NULL, status) > 0)
        {
            /* use actual data minimum value for the histogram minimum */
            *status = 0;
            if (fits_get_col_minmax(*fptr, histData.hcolnum[ii], amin+ii, &datamax, status) > 0)
            {
                strcpy(errmsg, "Error calculating datamin and datamax for column: ");
                strncat(errmsg, colname[ii],FLEN_ERRMSG-strlen(errmsg)-1);
                ffpmsg(errmsg);
                return(*status);
            }
         }
      }
      else
      {
        amin[ii] = (double) minin[ii];
      }

      if (maxin[ii] == DOUBLENULLVALUE)
      {
        ffkeyn("TLMAX", histData.hcolnum[ii], keyname, status);
        if (ffgky(*fptr, TDOUBLE, keyname, &amax[ii], NULL, status) > 0)
        {
          *status = 0;
          if(datamax != DOUBLENULLVALUE)  /* already computed max value */
          {
             amax[ii] = datamax;
          }
          else
          {
             /* use actual data maximum value for the histogram maximum */
             if (fits_get_col_minmax(*fptr, histData.hcolnum[ii], &datamin, &amax[ii], status) > 0)
             {
                 strcpy(errmsg, "Error calculating datamin and datamax for column: ");
                 strncat(errmsg, colname[ii],FLEN_ERRMSG-strlen(errmsg)-1);
                 ffpmsg(errmsg);
                 return(*status);
             }
          }
        }
        use_datamax = 1;  /* flag that the max was determined by the data values */
                          /* and not specifically set by the calling program */
      }
      else
      {
        amax[ii] = (double) maxin[ii];
      }

      /* use TDBINn keyword or else 1 if bin size is not given */
      if (binsizein[ii] == DOUBLENULLVALUE)
      {
         tstatus = 0;
         ffkeyn("TDBIN", histData.hcolnum[ii], keyname, &tstatus);

         if (ffgky(*fptr, TDOUBLE, keyname, binsizein + ii, NULL, &tstatus) > 0)
         {
	    /* make at least 10 bins */
            binsizein[ii] = (amax[ii] - amin[ii]) / 10. ;
            if (binsizein[ii] > 1.)
                binsizein[ii] = 1.;  /* use default bin size */
         }
      }

      if ( (amin[ii] > amax[ii] && binsizein[ii] > 0. ) ||
           (amin[ii] < amax[ii] && binsizein[ii] < 0. ) )
          binsize[ii] = (double) -binsizein[ii];  /* reverse the sign of binsize */
      else
          binsize[ii] =  (double) binsizein[ii];  /* binsize has the correct sign */

      ibin = (int) binsize[ii];
      imin = (int) amin[ii];
      imax = (int) amax[ii];

      /* Determine the range and number of bins in the histogram. This  */
      /* depends on whether the input columns are integer or floats, so */
      /* treat each case separately.                                    */

      if (datatype <= TLONG && (double) imin == amin[ii] &&
 	                       (double) imax == amax[ii] &&
                               (double) ibin == binsize[ii] )
      {
        /* This is an integer column and integer limits were entered. */
        /* Shift the lower and upper histogramming limits by 0.5, so that */
        /* the values fall in the center of the bin, not on the edge. */

        haxes[ii] = (imax - imin) / ibin + 1;  /* last bin may only */
                                               /* be partially full */
        maxbin[ii] = (double) (haxes[ii] + 1.);  /* add 1. instead of .5 to avoid roundoff */

        if (amin[ii] < amax[ii])
        {
          amin[ii] = (double) (amin[ii] - 0.5);
          amax[ii] = (double) (amax[ii] + 0.5);
        }
        else
        {
          amin[ii] = (double) (amin[ii] + 0.5);
          amax[ii] = (double) (amax[ii] - 0.5);
        }
      }
      else if (use_datamax)  
      {
        /* Either the column datatype and/or the limits are floating point, */
        /* and the histogram limits are being defined by the min and max */
        /* values of the array.  Add 1 to the number of histogram bins to */
        /* make sure that pixels that are equal to the maximum or are */
        /* in the last partial bin are included.  */

        maxbin[ii] = (amax[ii] - amin[ii]) / binsize[ii]; 
        haxes[ii] = (long) (maxbin[ii] + 1);
      }
      else  
      {
        /*  float datatype column and/or limits, and the maximum value to */
        /*  include in the histogram is specified by the calling program. */
        /*  The lower limit is inclusive, but upper limit is exclusive    */
        maxbin[ii] = (amax[ii] - amin[ii]) / binsize[ii];
        haxes[ii] = (long) maxbin[ii];

        if (amin[ii] < amax[ii])
        {
          if (amin[ii] + (haxes[ii] * binsize[ii]) < amax[ii])
            haxes[ii]++;   /* need to include another partial bin */
        }
        else
        {
          if (amin[ii] + (haxes[ii] * binsize[ii]) > amax[ii])
            haxes[ii]++;   /* need to include another partial bin */
        }
      }
    }

       /* get the histogramming weighting factor */
    if (*wtcol)
    {
        /* first, look for a keyword with the weight value */
        if (ffgky(*fptr, TDOUBLE, wtcol, &histData.weight, NULL, status) )
        {
            /* not a keyword, so look for column with this name */
            *status = 0;

            /* get the column number in the table */
            if (ffgcno(*fptr, CASEINSEN, wtcol, &histData.wtcolnum, status) > 0)
            {
               ffpmsg(
               "keyword or column for histogram weights doesn't exist: ");
               ffpmsg(wtcol);
               return(*status);
            }

            histData.weight = DOUBLENULLVALUE;
        }
    }
    else
        histData.weight = (double) weightin;

    if (histData.weight <= 0. && histData.weight != DOUBLENULLVALUE)
    {
        ffpmsg("Illegal histogramming weighting factor <= 0.");
        return(*status = URL_PARSE_ERROR);
    }

    if (recip && histData.weight != DOUBLENULLVALUE)
       /* take reciprocal of weight */
       histData.weight = (double) (1.0 / histData.weight);

    histData.wtrecip = recip;
        
    /* size of histogram is now known, so create temp output file */
    if (ffinit(&histptr, outfile, status) > 0)
    {
        ffpmsg("failed to create temp output file for histogram");
        return(*status);
    }

    if (ffcrim(histptr, bitpix, histData.haxis, haxes, status) > 0)
    {
        ffpmsg("failed to create primary array histogram in temp file");
        ffclos(histptr, status);
        return(*status);
    }

    /* copy all non-structural keywords from the table to the image */
    fits_get_hdrspace(*fptr, &nkeys, NULL, status);
    for (ii = 1; ii <= nkeys; ii++)
    {
       fits_read_record(*fptr, ii, card, status);
       if (fits_get_keyclass(card) >= 120)
           fits_write_record(histptr, card, status);
    }           

    /* Set global variables with histogram parameter values.    */
    /* Use separate scalar variables rather than arrays because */
    /* it is more efficient when computing the histogram.       */

    histData.amin1 = amin[0];
    histData.maxbin1 = maxbin[0];
    histData.binsize1 = binsize[0];
    histData.haxis1 = haxes[0];

    if (histData.haxis > 1)
    {
      histData.amin2 = amin[1];
      histData.maxbin2 = maxbin[1];
      histData.binsize2 = binsize[1];
      histData.haxis2 = haxes[1];

      if (histData.haxis > 2)
      {
        histData.amin3 = amin[2];
        histData.maxbin3 = maxbin[2];
        histData.binsize3 = binsize[2];
        histData.haxis3 = haxes[2];

        if (histData.haxis > 3)
        {
          histData.amin4 = amin[3];
          histData.maxbin4 = maxbin[3];
          histData.binsize4 = binsize[3];
          histData.haxis4 = haxes[3];
        }
      }
    }

    /* define parameters of image for the iterator function */
    fits_iter_set_file(imagepars, histptr);        /* pointer to image */
    fits_iter_set_datatype(imagepars, imagetype);  /* image datatype   */
    fits_iter_set_iotype(imagepars, OutputCol);    /* image is output  */

    /* call the iterator function to write out the histogram image */
    if (fits_iterate_data(n_cols, imagepars, offset, n_per_loop,
                          ffwritehisto, (void*)&histData, status) )
         return(*status);

    /* write the World Coordinate System (WCS) keywords */
    /* create default values if WCS keywords are not present in the table */
    for (ii = 0; ii < histData.haxis; ii++)
    {
     /*  CTYPEn  */
       tstatus = 0;
       ffkeyn("TCTYP", histData.hcolnum[ii], keyname, &tstatus);
       ffgky(*fptr, TSTRING, keyname, svalue, NULL, &tstatus);
       if (tstatus)
       {               /* just use column name as the type */
          tstatus = 0;
          ffkeyn("TTYPE", histData.hcolnum[ii], keyname, &tstatus);
          ffgky(*fptr, TSTRING, keyname, svalue, NULL, &tstatus);
       }

       if (!tstatus)
       {
        ffkeyn("CTYPE", ii + 1, keyname, &tstatus);
        ffpky(histptr, TSTRING, keyname, svalue, "Coordinate Type", &tstatus);
       }
       else
          tstatus = 0;

     /*  CUNITn  */
       ffkeyn("TCUNI", histData.hcolnum[ii], keyname, &tstatus);
       ffgky(*fptr, TSTRING, keyname, svalue, NULL, &tstatus);
       if (tstatus)
       {         /* use the column units */
          tstatus = 0;
          ffkeyn("TUNIT", histData.hcolnum[ii], keyname, &tstatus);
          ffgky(*fptr, TSTRING, keyname, svalue, NULL, &tstatus);
       }

       if (!tstatus)
       {
        ffkeyn("CUNIT", ii + 1, keyname, &tstatus);
        ffpky(histptr, TSTRING, keyname, svalue, "Coordinate Units", &tstatus);
       }
       else
         tstatus = 0;

     /*  CRPIXn  - Reference Pixel  */
       ffkeyn("TCRPX", histData.hcolnum[ii], keyname, &tstatus);
       ffgky(*fptr, TDOUBLE, keyname, &dvalue, NULL, &tstatus);
       if (tstatus)
       {
         dvalue = 1.0; /* choose first pixel in new image as ref. pix. */
         tstatus = 0;
       }
       else
       {
           /* calculate locate of the ref. pix. in the new image */
           dvalue = (dvalue - amin[ii]) / binsize[ii] + .5;
       }

       ffkeyn("CRPIX", ii + 1, keyname, &tstatus);
       ffpky(histptr, TDOUBLE, keyname, &dvalue, "Reference Pixel", &tstatus);

     /*  CRVALn - Value at the location of the reference pixel */
       ffkeyn("TCRVL", histData.hcolnum[ii], keyname, &tstatus);
       ffgky(*fptr, TDOUBLE, keyname, &dvalue, NULL, &tstatus);
       if (tstatus)
       {
         /* calculate value at ref. pix. location (at center of 1st pixel) */
         dvalue = amin[ii] + binsize[ii]/2.;
         tstatus = 0;
       }

       ffkeyn("CRVAL", ii + 1, keyname, &tstatus);
       ffpky(histptr, TDOUBLE, keyname, &dvalue, "Reference Value", &tstatus);

     /*  CDELTn - unit size of pixels  */
       ffkeyn("TCDLT", histData.hcolnum[ii], keyname, &tstatus);
       ffgky(*fptr, TDOUBLE, keyname, &dvalue, NULL, &tstatus);
       if (tstatus)
       {
         dvalue = 1.0;  /* use default pixel size */
         tstatus = 0;
       }

       dvalue = dvalue * binsize[ii];
       ffkeyn("CDELT", ii + 1, keyname, &tstatus);
       ffpky(histptr, TDOUBLE, keyname, &dvalue, "Pixel size", &tstatus);

     /*  CROTAn - Rotation angle (degrees CCW)  */
     /*  There should only be a CROTA2 keyword, and only for 2+ D images */
       if (ii == 1)
       {
         ffkeyn("TCROT", histData.hcolnum[ii], keyname, &tstatus);
         ffgky(*fptr, TDOUBLE, keyname, &dvalue, NULL, &tstatus);
         if (!tstatus && dvalue != 0.)  /* only write keyword if angle != 0 */
         {
           ffkeyn("CROTA", ii + 1, keyname, &tstatus);
           ffpky(histptr, TDOUBLE, keyname, &dvalue,
                 "Rotation angle", &tstatus);
         }
         else
         {
            /* didn't find CROTA for the 2nd axis, so look for one */
            /* on the first axis */
           tstatus = 0;
           ffkeyn("TCROT", histData.hcolnum[0], keyname, &tstatus);
           ffgky(*fptr, TDOUBLE, keyname, &dvalue, NULL, &tstatus);
           if (!tstatus && dvalue != 0.)  /* only write keyword if angle != 0 */
           {
             dvalue *= -1.;   /* negate the value, because mirror image */
             ffkeyn("CROTA", ii + 1, keyname, &tstatus);
             ffpky(histptr, TDOUBLE, keyname, &dvalue,
                   "Rotation angle", &tstatus);
           }
         }
       }
    }

    /* convert any TPn_k keywords to PCi_j; the value remains unchanged */
    /* also convert any TCn_k to CDi_j; the value is modified by n binning size */
    /* This is a bit of a kludge, and only works for 2D WCS */

    if (histData.haxis == 2) {

      /* PC1_1 */
      tstatus = 0;
      ffkeyn("TP", histData.hcolnum[0], card, &tstatus);
      strcat(card,"_");
      ffkeyn(card, histData.hcolnum[0], keyname, &tstatus);
      ffgky(*fptr, TDOUBLE, keyname, &dvalue, card, &tstatus);
      if (!tstatus) 
         ffpky(histptr, TDOUBLE, "PC1_1", &dvalue, card, &tstatus);

      tstatus = 0;
      keyname[1] = 'C';
      ffgky(*fptr, TDOUBLE, keyname, &dvalue, card, &tstatus);
      if (!tstatus) {
         dvalue *=  binsize[0];
         ffpky(histptr, TDOUBLE, "CD1_1", &dvalue, card, &tstatus);
      }

      /* PC1_2 */
      tstatus = 0;
      ffkeyn("TP", histData.hcolnum[0], card, &tstatus);
      strcat(card,"_");
      ffkeyn(card, histData.hcolnum[1], keyname, &tstatus);
      ffgky(*fptr, TDOUBLE, keyname, &dvalue, card, &tstatus);
      if (!tstatus) 
         ffpky(histptr, TDOUBLE, "PC1_2", &dvalue, card, &tstatus);
 
      tstatus = 0;
      keyname[1] = 'C';
      ffgky(*fptr, TDOUBLE, keyname, &dvalue, card, &tstatus);
      if (!tstatus) {
        dvalue *=  binsize[0];
        ffpky(histptr, TDOUBLE, "CD1_2", &dvalue, card, &tstatus);
      }
       
      /* PC2_1 */
      tstatus = 0;
      ffkeyn("TP", histData.hcolnum[1], card, &tstatus);
      strcat(card,"_");
      ffkeyn(card, histData.hcolnum[0], keyname, &tstatus);
      ffgky(*fptr, TDOUBLE, keyname, &dvalue, card, &tstatus);
      if (!tstatus) 
         ffpky(histptr, TDOUBLE, "PC2_1", &dvalue, card, &tstatus);
 
      tstatus = 0;
      keyname[1] = 'C';
      ffgky(*fptr, TDOUBLE, keyname, &dvalue, card, &tstatus);
      if (!tstatus) {
         dvalue *=  binsize[1];
         ffpky(histptr, TDOUBLE, "CD2_1", &dvalue, card, &tstatus);
      }
       
       /* PC2_2 */
      tstatus = 0;
      ffkeyn("TP", histData.hcolnum[1], card, &tstatus);
      strcat(card,"_");
      ffkeyn(card, histData.hcolnum[1], keyname, &tstatus);
      ffgky(*fptr, TDOUBLE, keyname, &dvalue, card, &tstatus);
      if (!tstatus) 
         ffpky(histptr, TDOUBLE, "PC2_2", &dvalue, card, &tstatus);
        
      tstatus = 0;
      keyname[1] = 'C';
      ffgky(*fptr, TDOUBLE, keyname, &dvalue, card, &tstatus);
      if (!tstatus) {
         dvalue *=  binsize[1];
         ffpky(histptr, TDOUBLE, "CD2_2", &dvalue, card, &tstatus);
      }
    }   
       
    /* finally, close the original file and return ptr to the new image */
    ffclos(*fptr, status);
    *fptr = histptr;

    return(*status);
}